

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall
acto::core::anon_unknown_0::binding_context_t::~binding_context_t(binding_context_t *this)

{
  object_t *obj_00;
  bool bVar1;
  reference ppoVar2;
  runtime_t *this_00;
  object_t *obj;
  iterator __end3;
  iterator __begin3;
  unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
  *__range3;
  binding_context_t *this_local;
  
  __end3 = std::
           unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
           ::begin(&this->actors);
  obj = (object_t *)
        std::
        unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
        ::end(&this->actors);
  while( true ) {
    bVar1 = std::__detail::operator==
                      (&__end3.super__Node_iterator_base<acto::core::object_t_*,_false>,
                       (_Node_iterator_base<acto::core::object_t_*,_false> *)&obj);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppoVar2 = std::__detail::_Node_iterator<acto::core::object_t_*,_true,_false>::operator*(&__end3)
    ;
    obj_00 = *ppoVar2;
    this_00 = runtime_t::instance();
    runtime_t::deconstruct_object(this_00,obj_00);
    std::__detail::_Node_iterator<acto::core::object_t_*,_true,_false>::operator++(&__end3);
  }
  process_actors(this,true);
  std::
  unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
  ::~unordered_set(&this->actors);
  return;
}

Assistant:

~binding_context_t() {
    // Mark all actors as deleting to prevent message loops.
    for (auto* obj : actors) {
      runtime_t::instance()->deconstruct_object(obj);
    }

    process_actors(true);
  }